

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.h
# Opt level: O2

bool __thiscall Bucket<int>::readAndRemove(Bucket<int> *this,int pos)

{
  int *piVar1;
  
  if (this->bsize != 0) {
    for (piVar1 = (this->blocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar1 != (this->blocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar1 = piVar1 + 1) {
      if (*piVar1 == pos) {
        *piVar1 = -1;
        this->bsize = this->bsize + -1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool readAndRemove(label_t pos)
      {
         if(bsize == 0)
            return false;
         for(auto &v : blocks)
         {
            if(v == pos)
            {
               v = -1;
               --bsize;
               return true;
            }
         }
         return false;
      }